

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall
backward::TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>::load_addresses
          (TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol> *this,
          void **addresses,int address_count)

{
  char **new_val;
  
  if (address_count != 0) {
    new_val = (char **)backtrace_symbols(addresses,address_count);
    details::handle<char_**,_backward::details::deleter<void,_void_*,_&free>_>::reset
              (&this->_symbols,new_val);
    return;
  }
  return;
}

Assistant:

void load_addresses(void *const*addresses, int address_count) override {
    if (address_count == 0) {
      return;
    }
    _symbols.reset(backtrace_symbols(addresses, address_count));
  }